

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_texture.c
# Opt level: O0

bool_t prf_vertex_with_texture_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int iVar1;
  int iVar2;
  ushort *in_RDI;
  node_data_conflict16 *data;
  uint8_t *in_stack_00000008;
  int pos;
  undefined8 in_stack_ffffffffffffffd8;
  uint16_t value_01;
  float64_t value;
  float32_t value_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  value_01 = (uint16_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  if (*in_RDI != prf_vertex_with_texture_info.opcode) {
    prf_error(9,"tried vertex with texture save method for node of type %d.",(ulong)*in_RDI);
  }
  bf_put_uint16_be((bfile_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),value_01
                  );
  bf_put_uint16_be((bfile_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),value_01
                  );
  iVar3 = 4;
  value = *(float64_t *)(in_RDI + 4);
  bf_put_uint16_be((bfile_t *)CONCAT44(4,in_stack_ffffffffffffffe0),(uint16_t)((ulong)value >> 0x30)
                  );
  iVar3 = iVar3 + 2;
  bf_put_uint16_be((bfile_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                   (uint16_t)((ulong)value >> 0x30));
  iVar3 = iVar3 + 2;
  bf_put_float64_be((bfile_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),value);
  iVar3 = iVar3 + 8;
  bf_put_float64_be((bfile_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),value);
  iVar3 = iVar3 + 8;
  bf_put_float64_be((bfile_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),value);
  value_00 = (float32_t)((ulong)value >> 0x20);
  iVar1 = iVar3 + 8;
  if (iVar3 + 0xc <= (int)(uint)in_RDI[1]) {
    bf_put_float32_be((bfile_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),value_00);
    iVar3 = iVar1 + 4;
    iVar2 = iVar1 + 8;
    iVar1 = iVar3;
    if (iVar2 <= (int)(uint)in_RDI[1]) {
      bf_put_float32_be((bfile_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),value_00);
      iVar2 = iVar3 + 4;
      iVar1 = iVar2;
      if (iVar3 + 8 <= (int)(uint)in_RDI[1]) {
        bf_put_uint32_be((bfile_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(uint32_t)value_00);
        iVar1 = iVar2 + 4;
        if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
          bf_put_uint32_be((bfile_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(uint32_t)value_00);
          iVar1 = iVar1 + 4;
        }
      }
    }
  }
  if (iVar1 < (int)(uint)in_RDI[1]) {
    bf_write(bfile,in_stack_00000008,data._4_4_);
  }
  return 1;
}

Assistant:

static
bool_t
prf_vertex_with_texture_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && bfile != NULL );

    if ( node->opcode != prf_vertex_with_texture_info.opcode ) {
        prf_error( 9,
            "tried vertex with texture save method for node of type %d.",
            node->opcode );
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        assert( data != NULL );
 
        bf_put_uint16_be( bfile, data->color_name_index ); pos += 2;
        bf_put_uint16_be( bfile, data->flags ); pos += 2;
        bf_put_float64_be( bfile, prf_dblread( data->x ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->y ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->z ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->texture[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->texture[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->color_index ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}